

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O1

CloudNode * Lpk_CutTruthBdd_rec(CloudManager *dd,Hop_Man_t *pMan,Hop_Obj_t *pObj,int nVars)

{
  uint uVar1;
  CloudNode *pCVar2;
  CloudNode *pCVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                  ,0x31,
                  "CloudNode *Lpk_CutTruthBdd_rec(CloudManager *, Hop_Man_t *, Hop_Obj_t *, int)");
  }
  pCVar2 = (CloudNode *)(pObj->field_0).pData;
  if (pCVar2 == (CloudNode *)0x0) {
    uVar1 = *(uint *)&pObj->field_0x20 & 7;
    if (uVar1 == 4) {
      pCVar2 = Lpk_CutTruthBdd_rec(dd,pMan,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),
                                   nVars);
      pCVar3 = Lpk_CutTruthBdd_rec(dd,pMan,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),
                                   nVars);
      pCVar2 = Cloud_bddAnd(dd,(CloudNode *)((ulong)((uint)pObj->pFanin0 & 1) ^ (ulong)pCVar2),
                            (CloudNode *)((ulong)((uint)pObj->pFanin1 & 1) ^ (ulong)pCVar3));
    }
    else {
      if (uVar1 != 1) {
        __assert_fail("Hop_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                      ,0x3c,
                      "CloudNode *Lpk_CutTruthBdd_rec(CloudManager *, Hop_Man_t *, Hop_Obj_t *, int)"
                     );
      }
      pCVar2 = dd->one;
    }
    (pObj->field_0).pData = pCVar2;
  }
  else if ((short)((ulong)pCVar2 >> 0x10) == 0) {
    __assert_fail("((unsigned)(ABC_PTRUINT_T)pObj->pData) & 0xffff0000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                  ,0x34,
                  "CloudNode *Lpk_CutTruthBdd_rec(CloudManager *, Hop_Man_t *, Hop_Obj_t *, int)");
  }
  return pCVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes the truth table of one cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
CloudNode * Lpk_CutTruthBdd_rec( CloudManager * dd, Hop_Man_t * pMan, Hop_Obj_t * pObj, int nVars )
{
    CloudNode * pTruth, * pTruth0, * pTruth1;
    assert( !Hop_IsComplement(pObj) );
    if ( pObj->pData )
    {
        assert( ((unsigned)(ABC_PTRUINT_T)pObj->pData) & 0xffff0000 );
        return (CloudNode *)pObj->pData;
    }
    // get the plan for a new truth table
    if ( Hop_ObjIsConst1(pObj) )
        pTruth = dd->one;
    else
    {
        assert( Hop_ObjIsAnd(pObj) );
        // compute the truth tables of the fanins
        pTruth0 = Lpk_CutTruthBdd_rec( dd, pMan, Hop_ObjFanin0(pObj), nVars );
        pTruth1 = Lpk_CutTruthBdd_rec( dd, pMan, Hop_ObjFanin1(pObj), nVars );
        pTruth0 = Cloud_NotCond( pTruth0, Hop_ObjFaninC0(pObj) );
        pTruth1 = Cloud_NotCond( pTruth1, Hop_ObjFaninC1(pObj) );
        // creat the truth table of the node
        pTruth = Cloud_bddAnd( dd, pTruth0, pTruth1 );
    }
    pObj->pData = pTruth;
    return pTruth;
}